

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall Js::JavascriptLibrary::InitializePrototypes(JavascriptLibrary *this)

{
  bool bVar1;
  Type *type;
  Recycler *pRVar2;
  RecyclableObject *this_00;
  TypePath *ptr;
  DynamicType *pDVar3;
  ObjectPrototypeObject *ptr_00;
  DynamicObject *pDVar4;
  JavascriptArray *ptr_01;
  JavascriptBooleanObject *this_01;
  JavascriptNumberObject *this_02;
  Recycler *pRVar5;
  JavascriptBigIntObject *this_03;
  JavascriptStringObject *this_04;
  JavascriptError *pJVar6;
  JavascriptDate *this_05;
  JavascriptFunction *this_06;
  ThreadConfiguration *pTVar7;
  ScriptContext *pSVar8;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  pRVar5 = this->recycler;
  type = &StaticType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Null,
                          (RecyclableObject *)0x0,(JavascriptMethod)0x0)->super_Type;
  local_60 = (undefined1  [8])&RecyclableObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0xad;
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_60);
  this_00 = (RecyclableObject *)new<Memory::Recycler>(0x10,pRVar2,0x37a1d4);
  RecyclableObject::RecyclableObject(this_00,type);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).nullValue,this_00);
  Js::Type::SetHasSpecialPrototype
            ((((this->super_JavascriptLibraryBase).nullValue.ptr)->type).ptr,true);
  ptr = TypePath::New(pRVar5,0x10);
  Memory::WriteBarrierPtr<Js::TypePath>::WriteBarrierSet(&this->rootPath,ptr);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (this->super_JavascriptLibraryBase).nullValue.ptr,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeObjectPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  ptr_00 = ObjectPrototypeObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::ObjectPrototypeObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).objectPrototype,ptr_00);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)SharedPrototypeTypeHandler,
                            true,true);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierSet
            (&this->constructorPrototypeObjectType,pDVar3);
  DynamicType::SetHasNoEnumerableProperties((this->constructorPrototypeObjectType).ptr,true);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayBufferPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).arrayBufferPrototype,pDVar4);
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ESSharedArrayBuffer == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSharedArrayBufferPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&this->sharedArrayBufferPrototype,pDVar4);
    pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  }
  else {
    (this->sharedArrayBufferPrototype).ptr = (DynamicObject *)0x0;
  }
  pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDataViewPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).dataViewPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypedArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).typedArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt8ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Int8ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint8ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Uint8ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint8ClampedArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Uint8ClampedArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt16ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Int16ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint16ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Uint16ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt32ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Int32ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint32ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Uint32ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFloat32ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Float32ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFloat64ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Float64ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt64ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Int64ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint64ArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).Uint64ArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBoolArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).BoolArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).typedArrayPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeCharArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).CharArrayPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Array,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  ptr_01 = JavascriptArray::New<void*,Js::JavascriptArray,0u>(0,pDVar3,pRVar5);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).arrayPrototype,(DynamicObject *)ptr_01);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,
                            TypeIds_BooleanObject,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBooleanPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptBooleanObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x10d;
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_60);
  this_01 = (JavascriptBooleanObject *)new<Memory::Recycler>(0x28,pRVar2,0x37a1d4);
  data._32_8_ = pRVar5;
  JavascriptBooleanObject::JavascriptBooleanObject(this_01,(JavascriptBoolean *)0x0,pDVar3);
  pRVar5 = (Recycler *)data._32_8_;
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).booleanPrototype,(DynamicObject *)this_01);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,
                            TypeIds_NumberObject,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeNumberPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptNumberObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x111;
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_60);
  this_02 = (JavascriptNumberObject *)new<Memory::Recycler>(0x28,pRVar2,0x37a1d4);
  JavascriptNumberObject::JavascriptNumberObject(this_02,&DAT_1000000000000,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).numberPrototype,(DynamicObject *)this_02);
  (this->super_JavascriptLibraryBase).bigintPrototype.ptr = (DynamicObject *)0x0;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ESBigInt == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_BigIntObject,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBigIntPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptBigIntObject::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x118;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_60);
    this_03 = (JavascriptBigIntObject *)new<Memory::Recycler>(0x28,pRVar5,0x37a1d4);
    JavascriptBigIntObject::JavascriptBigIntObject(this_03,(JavascriptBigInt *)0x0,pDVar3);
    pRVar5 = (Recycler *)data._32_8_;
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).bigintPrototype,(DynamicObject *)this_03);
    pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  }
  pDVar3 = DynamicType::New(pSVar8,TypeIds_StringObject,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeStringPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptStringObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x11d;
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_60);
  this_04 = (JavascriptStringObject *)new<Memory::Recycler>(0x28,pRVar2,0x37a1d4);
  JavascriptStringObject::JavascriptStringObject(this_04,(JavascriptString *)0x0,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).stringPrototype,(DynamicObject *)this_04);
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDatePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).datePrototype,pDVar4);
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRegexPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).regexPrototype,pDVar4);
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
  }
  else {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Date,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDatePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptDate::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x133;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_60);
    this_05 = (JavascriptDate *)new<Memory::Recycler>(0x80,pRVar5,0x51e21e);
    JavascriptDate::JavascriptDate(this_05,NAN,pDVar3);
    pRVar5 = (Recycler *)data._32_8_;
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).datePrototype,(DynamicObject *)this_05);
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Error,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x137;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
    JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).errorPrototype,&pJVar6->super_DynamicObject);
  pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeEvalErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
  }
  else {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeEvalErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x148;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
    JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).evalErrorPrototype,&pJVar6->super_DynamicObject);
  pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRangeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
  }
  else {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRangeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x149;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
    JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).rangeErrorPrototype,&pJVar6->super_DynamicObject);
  pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeReferenceErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
  }
  else {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeReferenceErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x14a;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
    JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).referenceErrorPrototype,
             &pJVar6->super_DynamicObject);
  pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSyntaxErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
  }
  else {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSyntaxErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x14b;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
    JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).syntaxErrorPrototype,&pJVar6->super_DynamicObject)
  ;
  pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
  }
  else {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x14c;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
    JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).typeErrorPrototype,&pJVar6->super_DynamicObject);
  pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeURIErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
  }
  else {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeURIErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x14d;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
    JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).uriErrorPrototype,&pJVar6->super_DynamicObject);
  pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAggregateErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
  }
  else {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAggregateErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&JavascriptError::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x14e;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
    JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).aggregateErrorPrototype,
             &pJVar6->super_DynamicObject);
  if ((DAT_014302fb == '\x01') && (bVar1 = PhaseIsEnabled::WasmPhase(), bVar1)) {
    pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
    pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
    if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
      pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyCompileErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                ::defaultInstance,false,false);
      pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
    }
    else {
      pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyCompileErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                ::defaultInstance,false,false);
      local_60 = (undefined1  [8])&JavascriptError::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x153;
      pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
      pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
      JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
    }
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&this->webAssemblyCompileErrorPrototype,&pJVar6->super_DynamicObject);
    pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
    pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
    if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
      pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyRuntimeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                ::defaultInstance,false,false);
      pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
    }
    else {
      pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyRuntimeErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                ::defaultInstance,false,false);
      local_60 = (undefined1  [8])&JavascriptError::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x154;
      pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
      pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
      JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
    }
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&this->webAssemblyRuntimeErrorPrototype,&pJVar6->super_DynamicObject);
    pDVar4 = (this->super_JavascriptLibraryBase).errorPrototype.ptr;
    pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
    if (((pSVar8->config).threadConfig)->m_ES6PrototypeChain == true) {
      pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,&pDVar4->super_RecyclableObject,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyLinkErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                ::defaultInstance,false,false);
      pJVar6 = (JavascriptError *)DynamicObject::New(pRVar5,pDVar3);
    }
    else {
      pDVar3 = DynamicType::New(pSVar8,TypeIds_Error,&pDVar4->super_RecyclableObject,
                                (JavascriptMethod)0x0,
                                (DynamicTypeHandler *)
                                DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyLinkErrorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                                ::defaultInstance,false,false);
      local_60 = (undefined1  [8])&JavascriptError::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x155;
      pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
      pJVar6 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x37a1d4);
      JavascriptError::JavascriptError(pJVar6,pDVar3,0,1);
    }
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&this->webAssemblyLinkErrorPrototype,&pJVar6->super_DynamicObject);
  }
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            JavascriptFunction::PrototypeEntryPoint,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFunctionPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  local_60 = (undefined1  [8])&JavascriptFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x15d;
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_60);
  this_06 = (JavascriptFunction *)new<Memory::Recycler>(0x30,pRVar2,0x37a1d4);
  JavascriptFunction::JavascriptFunction
            (this_06,pDVar3,(FunctionInfo *)JavascriptFunction::EntryInfo::PrototypeEntryPoint);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).functionPrototype,(DynamicObject *)this_06);
  (this->super_JavascriptLibraryBase).asyncGeneratorPrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).generatorPrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).asyncFunctionPrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).promisePrototype.ptr = (DynamicObject *)0x0;
  (this->super_JavascriptLibraryBase).generatorFunctionPrototype.ptr = (DynamicObject *)0x0;
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSymbolPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).symbolPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeMapPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).mapPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSetPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).setPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWeakMapPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).weakMapPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWeakSetPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).weakSetPrototype,pDVar4);
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar8->config).threadConfig)->m_ES2018AsyncIteration == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).asyncIteratorPrototype,pDVar4);
    pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  }
  pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).iteratorPrototype,pDVar4);
  bVar1 = ScriptContext::IsJsBuiltInEnabled((this->super_JavascriptLibraryBase).scriptContext.ptr);
  if (!bVar1) {
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).arrayIteratorPrototype,pDVar4);
  }
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeMapIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New((Recycler *)data._32_8_,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).mapIteratorPrototype,pDVar4);
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSetIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New((Recycler *)data._32_8_,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).setIteratorPrototype,pDVar4);
  pRVar5 = (Recycler *)data._32_8_;
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                             super_RecyclableObject,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializeStringIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).stringIteratorPrototype,pDVar4);
  if ((DAT_014302fb == '\x01') && (bVar1 = PhaseIsEnabled::WasmPhase(), bVar1)) {
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyMemoryPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New((Recycler *)data._32_8_,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&this->webAssemblyMemoryPrototype,pDVar4);
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyModulePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New((Recycler *)data._32_8_,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&this->webAssemblyModulePrototype,pDVar4);
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyInstancePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New((Recycler *)data._32_8_,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&this->webAssemblyInstancePrototype,pDVar4);
    pRVar5 = (Recycler *)data._32_8_;
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              (RecyclableObject *)
                              (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                              (JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyTablePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&this->webAssemblyTablePrototype,pDVar4);
  }
  pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                            (RecyclableObject *)
                            (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                            (JavascriptMethod)0x0,
                            (DynamicTypeHandler *)
                            DeferredTypeHandler<&Js::JavascriptLibrary::InitializePromisePrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                            ::defaultInstance,false,false);
  pDVar4 = DynamicObject::New(pRVar5,pDVar3);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).promisePrototype,pDVar4);
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  pTVar7 = (pSVar8->config).threadConfig;
  if (pTVar7->m_ES6Generators == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorFunctionPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New((Recycler *)data._32_8_,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).generatorFunctionPrototype,pDVar4);
    pRVar5 = (Recycler *)data._32_8_;
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).iteratorPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).generatorPrototype,pDVar4);
    pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
    pTVar7 = (pSVar8->config).threadConfig;
  }
  if (pTVar7->m_ES7AsyncAwait == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFunctionPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).asyncFunctionPrototype,pDVar4);
    pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
    pTVar7 = (pSVar8->config).threadConfig;
  }
  if (pTVar7->m_ES2018AsyncIteration == true) {
    pDVar3 = DynamicType::New(pSVar8,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncGeneratorFunctionPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype,pDVar4);
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).asyncIteratorPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncGeneratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).asyncGeneratorPrototype,pDVar4);
    pDVar3 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                              &((this->super_JavascriptLibraryBase).asyncIteratorPrototype.ptr)->
                               super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFromSyncIteratorPrototype,Js::DefaultDeferredTypeFilter,true,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
    pDVar4 = DynamicObject::New(pRVar5,pDVar3);
    Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
              (&(this->super_JavascriptLibraryBase).asyncFromSyncIteratorProtototype,pDVar4);
  }
  return;
}

Assistant:

void JavascriptLibrary::InitializePrototypes()
    {
        Recycler* recycler = this->GetRecycler();

        // Recycler macros below expect that their arguments will not throw when they're evaluated.
        // We allocate a lot of types for the built-in prototype objects which we need to store temporarily.
        DynamicType* tempDynamicType = nullptr;
        Type* tempType = StaticType::New(scriptContext, TypeIds_Null, nullptr, nullptr);
        nullValue = RecyclerNew(recycler, RecyclableObject, tempType);
        nullValue->GetType()->SetHasSpecialPrototype(true);
        this->rootPath = TypePath::New(recycler);

        // The prototype property of the object prototype is null.
        objectPrototype = ObjectPrototypeObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, nullValue, nullptr,
            DeferredTypeHandler<InitializeObjectPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        constructorPrototypeObjectType = DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
            &SharedPrototypeTypeHandler, true, true);

        constructorPrototypeObjectType->SetHasNoEnumerableProperties(true);

        arrayBufferPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeArrayBufferPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        if (scriptContext->GetConfig()->IsESSharedArrayBufferEnabled())
        {
            sharedArrayBufferPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                    DeferredTypeHandler<InitializeSharedArrayBufferPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));
        }
        else
        {
            sharedArrayBufferPrototype = nullptr;
        }

        dataViewPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDataViewPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        typedArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeTypedArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int8ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt8ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint8ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint8ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        // If ES6 TypedArrays are enabled, we have Khronos Interop mode enabled
        Uint8ClampedArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint8ClampedArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int16ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt16ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint16ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint16ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Float32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeFloat32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Float64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeFloat64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        BoolArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeBoolArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        CharArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeCharArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        arrayPrototype = JavascriptArray::New<Var, JavascriptArray, 0>(0,
            DynamicType::New(scriptContext, TypeIds_Array, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()), recycler);

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_BooleanObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeBooleanPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        booleanPrototype = RecyclerNew(recycler, JavascriptBooleanObject, nullptr, tempDynamicType);

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_NumberObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeNumberPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        numberPrototype = RecyclerNew(recycler, JavascriptNumberObject, TaggedInt::ToVarUnchecked(0), tempDynamicType);

        bigintPrototype = nullptr;
        if (scriptContext->GetConfig()->IsESBigIntEnabled())
        {
            tempDynamicType = DynamicType::New(scriptContext, TypeIds_BigIntObject, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeBigIntPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            bigintPrototype = RecyclerNew(recycler, JavascriptBigIntObject, nullptr, tempDynamicType);
        }

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_StringObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeStringPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        stringPrototype = RecyclerNew(recycler, JavascriptStringObject, nullptr, tempDynamicType);

        if (scriptContext->GetConfig()->IsES6PrototypeChain())
        {
            datePrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDatePrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

            regexPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeRegexPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

            errorPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                    DeferredTypeHandler<InitializeErrorPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));
        }
        else
        {
            double initDateValue = JavascriptNumber::NaN;

            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Date, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDatePrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            datePrototype = RecyclerNewZ(recycler, JavascriptDate, initDateValue, tempDynamicType);

            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Error, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeErrorPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            errorPrototype = RecyclerNew(this->GetRecycler(), JavascriptError, tempDynamicType, /*isExternalError*/FALSE, /*isPrototype*/TRUE);
        }

#define INIT_ERROR_PROTO(field, initFunc) \
        if (scriptContext->GetConfig()->IsES6PrototypeChain()) \
        { \
            field = DynamicObject::New(recycler, \
                DynamicType::New(scriptContext, TypeIds_Object, errorPrototype, nullptr, \
                DeferredTypeHandler<initFunc, DefaultDeferredTypeFilter, true>::GetDefaultInstance())); \
        } \
        else \
        { \
            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Error, errorPrototype, nullptr, \
                DeferredTypeHandler<initFunc, DefaultDeferredTypeFilter, true>::GetDefaultInstance()); \
            field = RecyclerNew(this->GetRecycler(), JavascriptError, tempDynamicType, /*isExternalError*/FALSE, /*isPrototype*/TRUE); \
        }